

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::BinarySequenceExprSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,BinarySequenceExprSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *pSVar1;
  size_t index_local;
  BinarySequenceExprSyntax *this_local;
  
  if (index == 0) {
    pSVar1 = &not_null<slang::syntax::SequenceExprSyntax_*>::get(&this->left)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else if (index == 1) {
    token.kind = (this->op).kind;
    token._2_1_ = (this->op).field_0x2;
    token.numFlags.raw = (this->op).numFlags.raw;
    token.rawLen = (this->op).rawLen;
    token.info = (this->op).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    pSVar1 = &not_null<slang::syntax::SequenceExprSyntax_*>::get(&this->right)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax BinarySequenceExprSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return left.get();
        case 1: return op;
        case 2: return right.get();
        default: return nullptr;
    }
}